

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

void dialer_connect_cb(void *arg)

{
  nni_aio *aio_00;
  nng_err num;
  uint32_t uVar1;
  nni_pipe *p;
  char *pcVar2;
  int rv;
  nni_aio *user_aio;
  nni_aio *aio;
  nni_dialer *d;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x98));
  aio_00 = *(nni_aio **)((long)arg + 0xd8);
  *(undefined8 *)((long)arg + 0xd8) = 0;
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x98));
  num = nni_aio_result((nni_aio *)((long)arg + 0xe0));
  if (num == NNG_OK) {
    nni_stat_inc((nni_stat_item *)((long)arg + 0x650),1);
    p = (nni_pipe *)nni_aio_get_output((nni_aio *)((long)arg + 0xe0),0);
    nni_pipe_start(p);
  }
  else if ((num - NNG_ETIMEDOUT < 2) ||
          (((num != NNG_ECLOSED && (num != NNG_ECANCELED)) && (num != NNG_ESTOPPED)))) {
    uVar1 = nni_sock_id(*(nni_sock **)((long)arg + 0x80));
    pcVar2 = nng_strerror(num);
    nng_log_warn("NNG-CONN-FAIL","Failed connecting socket<%u>: %s",(ulong)uVar1,pcVar2);
    nni_dialer_bump_error((nni_dialer *)arg,num);
    if (aio_00 == (nni_aio *)0x0) {
      nni_dialer_timer_start((nni_dialer *)arg);
    }
    else {
      nni_atomic_flag_reset((nni_atomic_flag *)((long)arg + 0x96));
    }
  }
  else {
    nni_dialer_bump_error((nni_dialer *)arg,num);
  }
  if (aio_00 != (nni_aio *)0x0) {
    nni_aio_finish(aio_00,num,0);
  }
  return;
}

Assistant:

static void
dialer_connect_cb(void *arg)
{
	nni_dialer *d   = arg;
	nni_aio    *aio = &d->d_con_aio;
	nni_aio    *user_aio;
	int         rv;

	nni_mtx_lock(&d->d_mtx);
	user_aio      = d->d_user_aio;
	d->d_user_aio = NULL;
	nni_mtx_unlock(&d->d_mtx);

	switch ((rv = nni_aio_result(aio))) {
	case 0:
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&d->st_connect, 1);
#endif
		nni_pipe_start(nni_aio_get_output(aio, 0));
		break;
	case NNG_ECLOSED:   // No further action.
	case NNG_ECANCELED: // No further action.
	case NNG_ESTOPPED:  // No further action.
		nni_dialer_bump_error(d, rv);
		break;
	case NNG_ECONNREFUSED:
	case NNG_ETIMEDOUT:
	default:
		nng_log_warn("NNG-CONN-FAIL",
		    "Failed connecting socket<%u>: %s", nni_sock_id(d->d_sock),
		    nng_strerror(rv));

		nni_dialer_bump_error(d, rv);
		if (user_aio == NULL) {
			nni_dialer_timer_start(d);
		} else {
			nni_atomic_flag_reset(&d->d_started);
		}
		break;
	}
	if (user_aio != NULL) {
		nni_aio_finish(user_aio, rv, 0);
	}
}